

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_conf_dh_param_ctx(mbedtls_ssl_config *conf,mbedtls_dhm_context *dhm_ctx)

{
  int iVar1;
  
  iVar1 = mbedtls_mpi_copy(&conf->dhm_P,&dhm_ctx->P);
  if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_copy(&conf->dhm_G,&dhm_ctx->G), iVar1 == 0)) {
    return 0;
  }
  mbedtls_mpi_free(&conf->dhm_P);
  mbedtls_mpi_free(&conf->dhm_G);
  return iVar1;
}

Assistant:

int mbedtls_ssl_conf_dh_param_ctx( mbedtls_ssl_config *conf, mbedtls_dhm_context *dhm_ctx )
{
    int ret;

    if( ( ret = mbedtls_mpi_copy( &conf->dhm_P, &dhm_ctx->P ) ) != 0 ||
        ( ret = mbedtls_mpi_copy( &conf->dhm_G, &dhm_ctx->G ) ) != 0 )
    {
        mbedtls_mpi_free( &conf->dhm_P );
        mbedtls_mpi_free( &conf->dhm_G );
        return( ret );
    }

    return( 0 );
}